

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O2

nni_sp_tran * nni_sp_tran_find(char *url)

{
  char *__s;
  int iVar1;
  nni_sp_tran *item;
  size_t __n;
  
  item = (nni_sp_tran *)nni_list_first(&sp_tran_list);
  do {
    if (item == (nni_sp_tran *)0x0) {
      return (nni_sp_tran *)0x0;
    }
    __s = item->tran_scheme;
    __n = strlen(__s);
    iVar1 = strncmp(url,__s,__n);
    if (iVar1 == 0) {
      if (url[__n] == '\0') {
        return item;
      }
      if (url[__n] == ':') {
        return item;
      }
    }
    item = (nni_sp_tran *)nni_list_next(&sp_tran_list,item);
  } while( true );
}

Assistant:

nni_sp_tran *
nni_sp_tran_find(const char *url)
{
	// address is of the form "<scheme>://blah..."
	nni_sp_tran *t;

	NNI_LIST_FOREACH (&sp_tran_list, t) {
		size_t len = strlen(t->tran_scheme);
		if ((strncmp(url, t->tran_scheme, len) == 0) &&
		    (url[len] == ':' || url[len] == '\0')) {
			return (t);
		}
	}
	return (NULL);
}